

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::SwitchStmt::set_target(SwitchStmt *this,shared_ptr<kratos::Var> *target)

{
  uint32_t width;
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  shared_ptr<kratos::Var> *target_local;
  SwitchStmt *this_local;
  
  local_28._16_8_ = target;
  target_local = (shared_ptr<kratos::Var> *)this;
  peVar2 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->target_stmt_);
  (*(peVar2->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  std::shared_ptr<kratos::Var>::operator=(&this->target_,(shared_ptr<kratos::Var> *)local_28._16_8_)
  ;
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28._16_8_);
  width = (*(peVar3->super_IRNode)._vptr_IRNode[0xd])();
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28._16_8_);
  iVar1 = (*(peVar3->super_IRNode)._vptr_IRNode[7])();
  Generator::get_auxiliary_var((Generator *)local_38,width,SUB41(iVar1,0));
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_38);
  Var::assign((Var *)local_28,(shared_ptr<kratos::Var> *)peVar3);
  std::shared_ptr<kratos::AssignStmt>::operator=
            (&this->target_stmt_,(shared_ptr<kratos::AssignStmt> *)local_28);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_28);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_38);
  peVar2 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->target_stmt_);
  (*(peVar2->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar2,this);
  return;
}

Assistant:

void SwitchStmt::set_target(const std::shared_ptr<Var> &target) {
    target_stmt_->clear();
    target_ = target;
    target_stmt_ = target->generator()->get_auxiliary_var(target->width())->assign(target);
    target_stmt_->set_parent(this);
}